

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O2

ssize_t __thiscall
jsoncons::stream_source<unsigned_char>::read
          (stream_source<unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  void *__dest;
  ulong uVar2;
  void *__n;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  __n = (void *)this->buffer_length_;
  if (__n == (void *)0x0) {
    __n = (void *)0x0;
  }
  else {
    if (__buf <= __n) {
      __n = __buf;
    }
    memcpy(__dest,this->buffer_data_,(size_t)__n);
    this->buffer_data_ = this->buffer_data_ + (long)__n;
    this->buffer_length_ = this->buffer_length_ - (long)__n;
    this->position_ = this->position_ + (long)__n;
  }
  uVar2 = (long)__buf - (long)__n;
  if (uVar2 != 0) {
    if (uVar2 < (ulong)((long)(this->buffer_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->buffer_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start)) {
      fill_buffer(this);
      uVar1 = this->buffer_length_;
      __buf = __n;
      if (uVar1 != 0) {
        if (uVar2 < uVar1) {
          uVar1 = uVar2;
        }
        memcpy((void *)((long)__dest + (long)__n),this->buffer_data_,uVar1);
        this->buffer_data_ = this->buffer_data_ + uVar1;
        this->buffer_length_ = this->buffer_length_ - uVar1;
        this->position_ = this->position_ + uVar1;
        __buf = (void *)(uVar1 + (long)__n);
      }
    }
    else if (((&this->stream_ptr_->field_0x20)[(long)this->stream_ptr_->_vptr_basic_istream[-3]] & 2
             ) == 0) {
      uVar1 = (**(code **)(*(long *)this->sbuf_ + 0x40))(this->sbuf_,(long)__dest + (long)__n,uVar2)
      ;
      if (uVar1 < uVar2) {
        std::ios::clear((int)this->stream_ptr_ + (int)this->stream_ptr_->_vptr_basic_istream[-3]);
      }
      __buf = (void *)((long)__n + uVar1);
      this->position_ = this->position_ + uVar1;
    }
    else {
      this->buffer_length_ = 0;
      __buf = (void *)0x0;
    }
  }
  return (ssize_t)__buf;
}

Assistant:

std::size_t read(value_type* p, std::size_t length)
        {
            std::size_t len = 0;
            if (buffer_length_ > 0)
            {
                len = (std::min)(buffer_length_, length);
                std::memcpy(p, buffer_data_, len*sizeof(value_type));
                buffer_data_ += len;
                buffer_length_ -= len;
                position_ += len;
            }
            if (length - len == 0)
            {
                return len;
            }
            else if (length - len < buffer_.size())
            {
                fill_buffer();
                if (buffer_length_ > 0)
                {
                    std::size_t len2 = (std::min)(buffer_length_, length-len);
                    std::memcpy(p+len, buffer_data_, len2*sizeof(value_type));
                    buffer_data_ += len2;
                    buffer_length_ -= len2;
                    position_ += len2;
                    len += len2;
                }
                return len;
            }
            else
            {
                if (stream_ptr_->eof())
                {
                    buffer_length_ = 0;
                    return 0;
                }
                JSONCONS_TRY
                {
                    std::streamsize count = sbuf_->sgetn(reinterpret_cast<char_type*>(p+len), length-len);
                    std::size_t len2 = static_cast<std::size_t>(count);
                    if (len2 < length-len)
                    {
                        stream_ptr_->clear(stream_ptr_->rdstate() | std::ios::eofbit);
                    }
                    len += len2;
                    position_ += len2;
                    return len;
                }
                JSONCONS_CATCH(const std::exception&)     
                {
                    stream_ptr_->clear(stream_ptr_->rdstate() | std::ios::badbit | std::ios::eofbit);
                    return 0;
                }
            }